

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O2

char * read_cstring(lua_State *L,bson_reader *br,size_t *sz)

{
  ulong uVar1;
  uint8_t *puVar2;
  ulong uVar3;
  
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (uVar3 == (uint)br->size) {
      luaL_error(L,"Invalid bson block : cstring");
    }
    puVar2 = br->ptr;
    uVar1 = uVar3 + 1;
  } while (puVar2[uVar3] != '\0');
  *sz = uVar3;
  br->ptr = puVar2 + (uVar1 & 0xffffffff);
  br->size = br->size - (int)uVar1;
  return (char *)puVar2;
}

Assistant:

static inline const char *
read_cstring(lua_State *L, struct bson_reader *br, size_t *sz) {
	int i;
	for (i=0;;i++) {
		if (i==br->size) {
			luaL_error(L, "Invalid bson block : cstring");
		}
		if (br->ptr[i] == '\0') {
			break;
		}
	}
	*sz = i;
	const char * r = (const char *)br->ptr;
	br->ptr += i+1;
	br->size -= i+1;
	return r;
}